

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::CreateContextCase::executeForConfig
          (CreateContextCase *this,EGLDisplay display,EGLConfig config)

{
  TestLog *pTVar1;
  EGLint EVar2;
  uint uVar3;
  deUint32 dVar4;
  int iVar5;
  Library *egl;
  size_t sVar6;
  undefined4 extraout_var;
  char *pcVar8;
  long lVar9;
  Hex<16UL> local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  deUint64 dVar7;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pTVar1 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  EVar2 = eglu::getConfigAttribInt(egl,display,config,0x3028);
  uVar3 = eglu::getConfigAttribInt(egl,display,config,0x3040);
  lVar9 = 0;
  do {
    if ((*(uint *)((long)&DAT_02162e0c + lVar9) & uVar3) != 0) {
      local_1b0 = (undefined1  [8])pTVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Creating ",9);
      pcVar8 = *(char **)((long)&s_apis + lVar9);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar6 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," context with config ID ",0x18);
      std::ostream::operator<<((ostringstream *)local_1a8,EVar2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"init",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                       ,0x5d);
      (**egl->_vptr_Library)(egl,(ulong)*(uint *)((long)&DAT_02162e08 + lVar9));
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"bindAPI(s_apis[apiNdx].api)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                       ,0x5f);
      iVar5 = (*egl->_vptr_Library[6])
                        (egl,display,config,0,*(undefined8 *)((long)&DAT_02162e10 + lVar9));
      dVar7 = CONCAT44(extraout_var,iVar5);
      iVar5 = (*egl->_vptr_Library[0x1f])(egl);
      if (dVar7 == 0 || iVar5 != 0x3000) {
        local_1b0 = (undefined1  [8])pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"  Fail, context: ",0x11);
        local_1b8.value = dVar7;
        tcu::Format::Hex<16UL>::toStream(&local_1b8,(ostream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", error: ",9);
        pcVar8 = eglu::getErrorName(iVar5);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)(ostringstream *)local_1a8 +
                          (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
        }
        else {
          sVar6 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar6);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Failed to create context");
      }
      else {
        (*egl->_vptr_Library[0x13])(egl,display,dVar7);
        dVar4 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar4,"destroyContext(display, context)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                         ,0x6c);
        local_1b0 = (undefined1  [8])pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Pass",6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
    }
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x78);
  return;
}

Assistant:

void CreateContextCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();
	TestLog&		log		= m_testCtx.getLog();
	EGLint			id		= eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID);
	EGLint			apiBits	= eglu::getConfigAttribInt(egl, display, config, EGL_RENDERABLE_TYPE);

	for (int apiNdx = 0; apiNdx < (int)DE_LENGTH_OF_ARRAY(s_apis); apiNdx++)
	{
		if ((apiBits & s_apis[apiNdx].apiBit) == 0)
			continue; // Not supported API

		log << TestLog::Message << "Creating " << s_apis[apiNdx].name << " context with config ID " << id << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "init");

		EGLU_CHECK_CALL(egl, bindAPI(s_apis[apiNdx].api));

		EGLContext	context = egl.createContext(display, config, EGL_NO_CONTEXT, s_apis[apiNdx].ctxAttrs);
		EGLenum		err		= egl.getError();

		if (context == EGL_NO_CONTEXT || err != EGL_SUCCESS)
		{
			log << TestLog::Message << "  Fail, context: " << tcu::toHex(context) << ", error: " << eglu::getErrorName(err) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to create context");
		}
		else
		{
			// Destroy
			EGLU_CHECK_CALL(egl, destroyContext(display, context));
			log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
	}
}